

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::RepeatedField
          (RepeatedField<int> *this,Arena *arena,RepeatedField<int> *rhs)

{
  bool bVar1;
  Arena *rhs_00;
  RepeatedField<int> *rhs_local;
  Arena *arena_local;
  RepeatedField<int> *this_local;
  
  RepeatedField(this,arena);
  rhs_00 = GetArena(rhs);
  bVar1 = internal::CanMoveWithInternalSwap(arena,rhs_00);
  if (bVar1) {
    InternalSwap(this,rhs);
  }
  else {
    CopyFrom(this,rhs);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(Arena* arena, RepeatedField&& rhs)
    : RepeatedField(arena) {
  if (internal::CanMoveWithInternalSwap(arena, rhs.GetArena())) {
    InternalSwap(&rhs);
  } else {
    // We don't just call Swap(&rhs) here because it would perform 3 copies if
    // rhs is on a different arena.
    CopyFrom(rhs);
  }
}